

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O0

void aq_make_frame(aq_t *q)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint local_5ea0;
  uint local_5e9c;
  uint data_length;
  uint to_offset;
  uint from_offset;
  int data_start;
  adu_t *adu;
  int data_end;
  uint frames_offset;
  mp3_frame_t frame;
  adu_t *top;
  dlist_t *dlist;
  aq_t *q_local;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x200,"void aq_make_frame(aq_t *)");
  }
  top = (adu_t *)aq_top_adu(q);
  if (top == (adu_t *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x203,
                  "void aq_make_frame(aq_t *)");
  }
  frame.raw._3992_8_ = *(undefined8 *)top;
  if ((void *)frame.raw._3992_8_ == (void *)0x0) {
    __assert_fail("top != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                  ,0x205,"void aq_make_frame(aq_t *)");
  }
  memcpy(&data_end,(void *)frame.raw._3992_8_,0x5e60);
  memset(&frame.usec,0,4000);
  adu._4_4_ = 0;
  do {
    if (top == (adu_t *)0x0) {
      __assert_fail("dlist != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x213,
                    "void aq_make_frame(aq_t *)");
    }
    lVar1 = *(long *)top;
    if (lVar1 == 0) {
      __assert_fail("adu != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x215,
                    "void aq_make_frame(aq_t *)");
    }
    local_5e9c = adu._4_4_ - *(int *)(lVar1 + 0x10);
    if ((long)frame.frame_size < (long)(int)local_5e9c) break;
    if ((long)frame.frame_size < (long)(int)local_5e9c) {
      __assert_fail("data_start <= (long)frame.frame_data_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x220,
                    "void aq_make_frame(aq_t *)");
    }
    lVar5 = minbla((long)(int)local_5e9c + *(long *)(lVar1 + 0x4e80),frame.frame_size);
    uVar2 = (uint)lVar5;
    if ((int)local_5e9c < 0) {
      data_length = -local_5e9c;
      local_5e9c = 0;
      local_5ea0 = uVar2;
      if ((int)uVar2 < 0) {
        local_5ea0 = 0;
      }
    }
    else {
      data_length = 0;
      local_5ea0 = uVar2 - local_5e9c;
    }
    if (local_5ea0 != 0) {
      if (*(ulong *)(lVar1 + 0x4e80) < (ulong)(data_length + local_5ea0)) {
        __assert_fail("adu->adu_size >= from_offset + data_length",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x237,
                      "void aq_make_frame(aq_t *)");
      }
      iVar3 = 2;
      if (data_end._2_1_ != '\0') {
        iVar3 = 0;
      }
      iVar4 = 2;
      if (*(char *)(lVar1 + 2) != '\0') {
        iVar4 = 0;
      }
      memcpy(frame.raw +
             (ulong)local_5e9c + (long)frame.si.channel[1].granule[1].samples[0x23f] + (long)iVar3 +
             -4,(void *)(lVar1 + 0x4ec4 + (long)iVar4 + *(long *)(lVar1 + 0x4e68) +
                        (ulong)data_length),(ulong)local_5ea0);
    }
    adu._4_4_ = adu._4_4_ + (int)*(undefined8 *)(lVar1 + 0x4eb0);
    top = *(adu_t **)&top->mode_ext;
  } while ((long)(int)uVar2 < (long)frame.frame_size);
  aq_discard_top_adu(q);
  aq_enqueue_frame(q,(mp3_frame_t *)&data_end);
  return;
}

Assistant:

static void aq_make_frame(aq_t *q) {
  assert(q != NULL);
  
  dlist_t *dlist = aq_top_adu(q);
  assert(dlist != NULL);
  adu_t *top = dlist->data;
  assert(top != NULL);

#ifdef DEBUG
  fprintf(stderr, "top adu size: %d, frame size: %d\n",
          top->adu_size, top->frame_data_size);
#endif
  
  mp3_frame_t frame;
  memcpy(&frame, top, sizeof(adu_t));
  memset(frame.raw, 0, MP3_RAW_SIZE);

  unsigned int frames_offset = 0;
  int data_end = 0;
  do {
    assert (dlist != NULL);
    adu_t *adu = dlist->data;
    assert(adu != NULL);

#ifdef DEBUG
    fprintf(stderr, "frames offset %d, backptr %d\n", frames_offset, adu->si.main_data_end);
#endif

    int data_start = frames_offset - adu->si.main_data_end;

    if (data_start > (long)frame.frame_data_size)
      break;

    assert(data_start <= (long)frame.frame_data_size);
    
    data_end = MIN(data_start + adu->adu_size, (long)frame.frame_data_size);
#ifdef DEBUG
    fprintf(stderr, "data_start: %d, data_end: %d\n", data_start, data_end);
#endif

    unsigned int from_offset, to_offset, data_length;
    if (data_start < 0) {
      from_offset = -data_start;
      to_offset = 0;
      
      if (data_end < 0)
        data_length = 0;
      else
        data_length = data_end;
    } else {
      from_offset = 0;
      to_offset = data_start;
      data_length = data_end - data_start;
    }

    if (data_length > 0) {
      assert(adu->adu_size >= from_offset + data_length);
#ifdef DEBUG
      fprintf(stderr, 
              "memcpy (size: %d) from [%d:%d] to [%d:%d]\n",
              adu->adu_size,
              from_offset, from_offset + data_length,
              to_offset, to_offset + data_length);
#endif
      memcpy(mp3_frame_data_begin(&frame) + to_offset,
             mp3_frame_data_begin(adu) + from_offset,
             data_length);
    }

    frames_offset += adu->frame_data_size;
    
    dlist = dlist->next;
  } while (data_end < (long)frame.frame_data_size);

  aq_discard_top_adu(q);
  aq_enqueue_frame(q, &frame);
}